

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
curi_url_decode(char *input,size_t inputLen,char *output,size_t outputCapacity,size_t *outputLen)

{
  char cVar1;
  ushort *puVar2;
  int iVar3;
  uint uVar4;
  curi_status cVar5;
  char *pcVar6;
  ushort **ppuVar7;
  __int32_t **pp_Var8;
  size_t __TRY_initialOffset;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  
  if (outputCapacity == 0) {
    uVar10 = 0;
  }
  else {
    sVar11 = 0;
    uVar9 = 0;
    do {
      pcVar6 = input + uVar9;
      if (inputLen <= uVar9) {
        pcVar6 = "";
      }
      uVar10 = uVar9;
      if (*pcVar6 == '%') {
        pcVar6 = input + uVar9 + 1;
        if (inputLen <= uVar9 + 1) {
          pcVar6 = "";
        }
        if ((0x36 < (byte)*pcVar6 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar6 - 0x30) & 0x3f) & 1) == 0))
        goto LAB_001024ba;
        pcVar6 = input + uVar9 + 2;
        if (inputLen <= uVar9 + 2) {
          pcVar6 = "";
        }
        if ((0x36 < (byte)*pcVar6 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar6 - 0x30) & 0x3f) & 1) == 0))
        goto LAB_001024ba;
        uVar10 = uVar9 + 3;
        ppuVar7 = __ctype_b_loc();
        puVar2 = *ppuVar7;
        cVar1 = input[uVar9 + 1];
        if ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 8) == 0) {
          pp_Var8 = __ctype_tolower_loc();
          iVar12 = (*pp_Var8)[cVar1] + -0x57;
        }
        else {
          iVar12 = cVar1 + -0x30;
          pp_Var8 = __ctype_tolower_loc();
        }
        iVar3 = (*pp_Var8)[input[uVar9 + 2]];
        if ((*(byte *)((long)puVar2 + (long)iVar3 * 2 + 1) & 8) == 0) {
          iVar3 = tolower(iVar3);
          uVar4 = iVar3 - 0x57;
        }
        else {
          uVar4 = iVar3 - 0x30;
        }
        uVar4 = iVar12 << 4 | uVar4;
        if (0x7f < (int)uVar4) goto LAB_001024ba;
        output[sVar11] = (char)uVar4;
      }
      else {
LAB_001024ba:
        pcVar6 = input + uVar10;
        if (inputLen <= uVar10) {
          pcVar6 = "";
        }
        cVar1 = *pcVar6;
        if (cVar1 == '+') {
          uVar10 = uVar10 + 1;
          output[sVar11] = ' ';
        }
        else {
          output[sVar11] = cVar1;
          if (cVar1 == '\0') goto LAB_0010250c;
          uVar10 = uVar10 + 1;
        }
      }
      sVar11 = sVar11 + 1;
      uVar9 = uVar10;
    } while (outputCapacity != sVar11);
  }
  pcVar6 = "";
  if (uVar10 < inputLen) {
    pcVar6 = input + uVar10;
  }
  cVar5 = curi_status_error;
  sVar11 = outputCapacity;
  if (*pcVar6 == '\0') {
LAB_0010250c:
    if (outputLen != (size_t *)0x0) {
      *outputLen = sVar11;
    }
    cVar5 = curi_status_success;
  }
  return cVar5;
}

Assistant:

curi_status curi_url_decode(const char* input, size_t inputLen, char* output, size_t outputCapacity, size_t* outputLen /*=0*/)
{
    curi_status status = curi_status_error;
    size_t inputOffset = 0;
    size_t outputOffset = 0;

    #define HEXTOI(x) (isdigit(x) ? x - '0' : tolower(x) - 'a' + 10)

    while ( outputOffset < outputCapacity )
    {
        status = curi_status_error;
        if (status == curi_status_error)
        {
            // percent encoding
            TRY(status, &inputOffset, parse_percent_encoded(input, inputLen, &inputOffset, 0, 0));

            if (status == curi_status_success)
            {
                int encodedChar = ((HEXTOI(input[inputOffset - 2]) << 4) | HEXTOI(tolower(input[inputOffset - 1])));
                if (encodedChar < 128) // Only support ascii percent encodage at the moment.
                {
                    output[outputOffset] = (char)encodedChar;
                    ++outputOffset;
                }
                else
                {
                    status = curi_status_error;
                }
            }
        }

        if (status == curi_status_error)
        {
            // '+' as a space
            TRY(status, &inputOffset, parse_char('+', input, inputLen, &inputOffset, 0, 0));
            if (status == curi_status_success)
            {
                 output[outputOffset] = ' ';
                 ++outputOffset;
            }
        }

        if (status == curi_status_error)
        {
            // "any" character
            output[outputOffset] = *read_char(input, inputLen, &inputOffset);
            if (output[outputOffset] == '\0')
            {
                if (outputLen)
                    *outputLen = outputOffset;

                return curi_status_success;
            }
            else
            {
                ++outputOffset;
            }
        }
    }

    if (*read_char(input, inputLen, &inputOffset) == '\0')
    {
        if (outputLen)
            *outputLen = outputOffset;

        return curi_status_success;
    }
    else
    {
        return curi_status_error;
    }
}